

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compression.cpp
# Opt level: O1

idx_t __thiscall
duckdb::DictionaryCompressionCompressState::Finalize(DictionaryCompressionCompressState *this)

{
  unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true> *this_00;
  uint32_t *puVar1;
  byte bVar2;
  data_ptr_t pdVar3;
  pointer puVar4;
  BlockManager *pBVar5;
  StringDictionaryContainer SVar6;
  undefined1 auVar7 [16];
  DictionaryCompressionCompressState *pDVar8;
  uint uVar9;
  DatabaseInstance *db;
  BufferManager *pBVar10;
  pointer pCVar11;
  unsigned_long uVar12;
  size_t __n;
  idx_t iVar13;
  idx_t iVar14;
  type pCVar15;
  idx_t iVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  pointer in;
  BufferHandle handle;
  BufferHandle local_100;
  unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true> *local_e8;
  ulong local_e0;
  ulong local_d8;
  ulong local_d0;
  DictionaryCompressionCompressState *local_c8;
  ulong local_c0;
  uint32_t local_b8 [34];
  
  db = ColumnDataCheckpointData::GetDatabase(this->checkpoint_data);
  pBVar10 = BufferManager::GetBufferManager(db);
  this_00 = &this->current_segment;
  pCVar11 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
            operator->(this_00);
  (*pBVar10->_vptr_BufferManager[7])(&local_100,pBVar10,&pCVar11->block);
  pCVar11 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
            operator->(this_00);
  uVar17 = (pCVar11->super_SegmentBase<duckdb::ColumnSegment>).count.
           super___atomic_base<unsigned_long>._M_i;
  local_c0 = (ulong)this->current_width;
  if ((uVar17 & 0x1f) != 0) {
    uVar12 = NumericCastImpl<unsigned_long,_int,_false>::Convert((uint)uVar17 & 0x1f);
    uVar17 = (uVar17 - uVar12) + 0x20;
  }
  __n = (long)(this->index_buffer).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(this->index_buffer).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start;
  local_e0 = (ulong)(this->current_dictionary).size;
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&local_100.node);
  pdVar3 = (local_100.node.ptr)->buffer;
  puVar4 = (this->selection_buffer).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_e8 = this_00;
  pCVar11 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
            operator->(this_00);
  local_d8 = (pCVar11->super_SegmentBase<duckdb::ColumnSegment>).count.
             super___atomic_base<unsigned_long>._M_i;
  bVar2 = this->current_width;
  uVar19 = local_d8 & 0xffffffffffffffe0;
  local_d0 = uVar17;
  local_c8 = this;
  if (uVar19 != 0) {
    uVar18 = 0;
    uVar17 = 0;
    in = puVar4;
    do {
      duckdb_fastpforlib::fastpack(in,(uint32_t *)(pdVar3 + (uVar18 >> 3) + 0x14),(uint)bVar2);
      uVar17 = uVar17 + 0x20;
      in = in + 0x20;
      uVar18 = uVar18 + (ulong)bVar2 * 0x20;
    } while (uVar17 < uVar19);
  }
  pDVar8 = local_c8;
  uVar17 = local_d0;
  if ((local_d8 & 0x1f) != 0) {
    uVar18 = (ulong)(((uint)local_d8 & 0x1f) << 2);
    switchD_01306cb1::default((void *)((long)local_b8 + uVar18),0,0x80 - uVar18);
    switchD_012dd528::default(local_b8,puVar4 + uVar19,uVar18);
    duckdb_fastpforlib::fastpack
              (local_b8,(uint32_t *)(pdVar3 + (bVar2 * uVar19 >> 3) + 0x14),(uint)bVar2);
  }
  uVar17 = uVar17 * local_c0 >> 3;
  uVar12 = uVar17 + 0x14;
  switchD_012dd528::default
            (pdVar3 + uVar12,
             (pDVar8->index_buffer).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start,__n);
  uVar9 = NumericCastImpl<unsigned_int,_unsigned_long,_false>::Convert(uVar12);
  *(uint *)(pdVar3 + 8) = uVar9;
  uVar9 = NumericCastImpl<unsigned_int,_unsigned_long,_false>::Convert
                    ((long)(pDVar8->index_buffer).
                           super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)(pDVar8->index_buffer).
                           super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start >> 2);
  *(uint *)(pdVar3 + 0xc) = uVar9;
  *(uint *)(pdVar3 + 0x10) = (uint)pDVar8->current_width;
  pBVar5 = (pDVar8->super_DictionaryCompressionState).super_CompressionState.info.block_manager;
  iVar13 = optional_idx::GetIndex(&pBVar5->block_alloc_size);
  iVar14 = optional_idx::GetIndex(&pBVar5->block_header_size);
  lVar20 = __n + uVar17 + 0x14;
  iVar16 = local_e0 + lVar20;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = iVar13 - iVar14;
  pBVar5 = (pDVar8->super_DictionaryCompressionState).super_CompressionState.info.block_manager;
  if (iVar16 < (SUB168(auVar7 * ZEXT816(0xcccccccccccccccd),8) & 0xfffffffffffffffc)) {
    iVar13 = optional_idx::GetIndex(&pBVar5->block_alloc_size);
    iVar14 = optional_idx::GetIndex(&pBVar5->block_header_size);
    uVar17 = (ulong)(pDVar8->current_dictionary).size;
    memmove(pdVar3 + lVar20,pdVar3 + ((pDVar8->current_dictionary).end - uVar17),uVar17);
    puVar1 = &(pDVar8->current_dictionary).end;
    *puVar1 = *puVar1 + (int)iVar14 + ((int)iVar16 - (int)iVar13);
    pCVar15 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
              operator*(local_e8);
    SVar6 = pDVar8->current_dictionary;
    optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&local_100.node);
    *(StringDictionaryContainer *)((local_100.node.ptr)->buffer + pCVar15->offset) = SVar6;
  }
  else {
    iVar16 = optional_idx::GetIndex(&pBVar5->block_alloc_size);
    iVar13 = optional_idx::GetIndex(&pBVar5->block_header_size);
    iVar16 = iVar16 - iVar13;
  }
  BufferHandle::~BufferHandle(&local_100);
  return iVar16;
}

Assistant:

idx_t DictionaryCompressionCompressState::Finalize() {
	auto &buffer_manager = BufferManager::GetBufferManager(checkpoint_data.GetDatabase());
	auto handle = buffer_manager.Pin(current_segment->block);
	D_ASSERT(current_dictionary.end == info.GetBlockSize());

	// calculate sizes
	auto compressed_selection_buffer_size =
	    BitpackingPrimitives::GetRequiredSize(current_segment->count, current_width);
	auto index_buffer_size = index_buffer.size() * sizeof(uint32_t);
	auto total_size = DictionaryCompression::DICTIONARY_HEADER_SIZE + compressed_selection_buffer_size +
	                  index_buffer_size + current_dictionary.size;

	// calculate ptr and offsets
	auto base_ptr = handle.Ptr();
	auto header_ptr = reinterpret_cast<dictionary_compression_header_t *>(base_ptr);
	auto compressed_selection_buffer_offset = DictionaryCompression::DICTIONARY_HEADER_SIZE;
	auto index_buffer_offset = compressed_selection_buffer_offset + compressed_selection_buffer_size;

	// Write compressed selection buffer
	BitpackingPrimitives::PackBuffer<sel_t, false>(base_ptr + compressed_selection_buffer_offset,
	                                               (sel_t *)(selection_buffer.data()), current_segment->count,
	                                               current_width);

	// Write the index buffer
	memcpy(base_ptr + index_buffer_offset, index_buffer.data(), index_buffer_size);

	// Store sizes and offsets in segment header
	Store<uint32_t>(NumericCast<uint32_t>(index_buffer_offset), data_ptr_cast(&header_ptr->index_buffer_offset));
	Store<uint32_t>(NumericCast<uint32_t>(index_buffer.size()), data_ptr_cast(&header_ptr->index_buffer_count));
	Store<uint32_t>((uint32_t)current_width, data_ptr_cast(&header_ptr->bitpacking_width));

	D_ASSERT(current_width == BitpackingPrimitives::MinimumBitWidth(index_buffer.size() - 1));
	D_ASSERT(DictionaryCompression::HasEnoughSpace(current_segment->count, index_buffer.size(), current_dictionary.size,
	                                               current_width, info.GetBlockSize()));
	D_ASSERT((uint64_t)*max_element(std::begin(selection_buffer), std::end(selection_buffer)) ==
	         index_buffer.size() - 1);

	// Early-out, if the block is sufficiently full.
	if (total_size >= info.GetCompactionFlushLimit()) {
		return info.GetBlockSize();
	}

	// Sufficient space: calculate how much space we can save.
	auto move_amount = info.GetBlockSize() - total_size;

	// Move the dictionary to align it with the offsets.
	auto new_dictionary_offset = index_buffer_offset + index_buffer_size;
	memmove(base_ptr + new_dictionary_offset, base_ptr + current_dictionary.end - current_dictionary.size,
	        current_dictionary.size);
	current_dictionary.end -= move_amount;
	D_ASSERT(current_dictionary.end == total_size);

	// Write the new dictionary with the updated "end".
	DictionaryCompression::SetDictionary(*current_segment, handle, current_dictionary);
	return total_size;
}